

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O2

int nn_ws_handshake_hash_key(char *key,size_t key_len,char *hashed,size_t hashed_len)

{
  uint uVar1;
  int iVar2;
  uint8_t *in;
  long lVar3;
  nn_sha1 hash;
  
  nn_sha1_init(&hash);
  for (uVar1 = 0; uVar1 < key_len; uVar1 = uVar1 + 1) {
    nn_sha1_hashbyte(&hash,key[uVar1]);
  }
  for (lVar3 = 0; lVar3 != 0x24; lVar3 = lVar3 + 1) {
    nn_sha1_hashbyte(&hash,"258EAFA5-E914-47DA-95CA-C5AB0DC85B11"[lVar3]);
  }
  in = nn_sha1_result(&hash);
  iVar2 = nn_base64_encode(in,0x14,hashed,0x1d);
  return iVar2;
}

Assistant:

static int nn_ws_handshake_hash_key (const char *key, size_t key_len,
    char *hashed, size_t hashed_len)
{
    int rc;
    unsigned i;
    struct nn_sha1 hash;

    nn_sha1_init (&hash);

    for (i = 0; i < key_len; i++)
        nn_sha1_hashbyte (&hash, key [i]);

    for (i = 0; i < strlen (NN_WS_HANDSHAKE_MAGIC_GUID); i++)
        nn_sha1_hashbyte (&hash, NN_WS_HANDSHAKE_MAGIC_GUID [i]);

    rc = nn_base64_encode (nn_sha1_result (&hash),
        sizeof (hash.state), hashed, hashed_len);

    return rc;
}